

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

bool __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
                 *this,insert_result *result,vec<6U,_float> *k,uint *v)

{
  long lVar1;
  float fVar2;
  raw_node *prVar3;
  undefined8 uVar4;
  long lVar5;
  uint32 uVar6;
  raw_node *prVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar6 = fast_hash(k,0x18);
  uVar8 = uVar6 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
  prVar3 = (this->m_values).m_p;
  prVar7 = prVar3 + uVar8;
  if (prVar3[uVar8].m_bits[0x1c] != '\0') {
    fVar2 = k->m_s[0];
    if ((*(float *)prVar7->m_bits == fVar2) && (!NAN(*(float *)prVar7->m_bits) && !NAN(fVar2))) {
      uVar10 = 0xffffffffffffffff;
      while (uVar10 != 4) {
        lVar1 = uVar10 * 4;
        uVar12 = uVar10 + 1;
        lVar5 = uVar10 + 2;
        if ((*(float *)(prVar3[uVar8].m_bits + lVar1 + 8) != k->m_s[lVar5]) ||
           (uVar10 = uVar12, NAN(*(float *)(prVar3[uVar8].m_bits + lVar1 + 8)) || NAN(k->m_s[lVar5])
           )) goto LAB_0018408d;
      }
      uVar12 = 5;
LAB_0018408d:
      if (4 < uVar12) {
        bVar14 = false;
        goto LAB_00184153;
      }
    }
    uVar11 = (this->m_values).m_size - 1;
    uVar10 = (ulong)(uVar8 - 1);
    if (uVar8 == 0) {
      uVar10 = (ulong)uVar11;
    }
    uVar9 = (uint)uVar10;
    prVar7 = prVar7 + -1;
    if (uVar8 == 0) {
      prVar7 = prVar3 + uVar11;
    }
    if (uVar8 == uVar9) {
      bVar14 = false;
    }
    else {
      do {
        uVar9 = (uint)uVar10;
        bVar14 = prVar7->m_bits[0x1c] == '\0';
        if (bVar14) break;
        if ((*(float *)prVar7->m_bits == fVar2) && (!NAN(*(float *)prVar7->m_bits) && !NAN(fVar2)))
        {
          uVar10 = 0xffffffffffffffff;
          while (uVar10 != 4) {
            lVar5 = uVar10 * 4;
            uVar12 = uVar10 + 1;
            lVar1 = uVar10 + 2;
            if ((*(float *)(prVar7->m_bits + lVar5 + 8) != k->m_s[lVar1]) ||
               (uVar10 = uVar12, NAN(*(float *)(prVar7->m_bits + lVar5 + 8)) || NAN(k->m_s[lVar1])))
            goto LAB_00184106;
          }
          uVar12 = 5;
LAB_00184106:
          if (4 < uVar12) {
            (result->first).m_pTable = this;
            (result->first).m_index = uVar9;
            result->second = false;
            bVar13 = true;
            bVar14 = false;
            uVar8 = uVar9;
            goto LAB_00184121;
          }
        }
        bVar13 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar13) {
          uVar9 = uVar11;
        }
        uVar10 = (ulong)uVar9;
        prVar7 = prVar7 + -1;
        if (bVar13) {
          prVar7 = prVar3 + uVar11;
        }
      } while (uVar8 != uVar9);
    }
    bVar13 = false;
    uVar8 = uVar9;
LAB_00184121:
    if (!bVar14) {
      return bVar13;
    }
  }
  if (this->m_grow_threshold <= this->m_num_valid) {
    return false;
  }
  *(undefined8 *)(prVar7->m_bits + 0x10) = *(undefined8 *)(k->m_s + 4);
  uVar4 = *(undefined8 *)(k->m_s + 2);
  *(undefined8 *)prVar7->m_bits = *(undefined8 *)k->m_s;
  *(undefined8 *)(prVar7->m_bits + 8) = uVar4;
  *(uint *)(prVar7->m_bits + 0x18) = *v;
  prVar7->m_bits[0x1c] = '\x01';
  this->m_num_valid = this->m_num_valid + 1;
  bVar14 = true;
LAB_00184153:
  (result->first).m_pTable = this;
  (result->first).m_index = uVar8;
  result->second = bVar14;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }